

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode curl_multi_cleanup(CURLM *m)

{
  _Bool _Var1;
  Curl_easy *local_38;
  Curl_easy *data;
  Curl_easy *pCStack_28;
  uint mid;
  void *entry;
  Curl_multi *multi;
  CURLM *m_local;
  
  if ((m == (CURLM *)0x0) || (*m != 0xbab1e)) {
    m_local._4_4_ = CURLM_BAD_HANDLE;
  }
  else if ((*(byte *)((long)m + 0x271) >> 2 & 1) == 0) {
    entry = m;
    multi = (Curl_multi *)m;
    _Var1 = Curl_uint_tbl_first((uint_tbl *)((long)m + 8),(uint *)((long)&data + 4),
                                &stack0xffffffffffffffd8);
    if (_Var1) {
      do {
        local_38 = pCStack_28;
        if ((pCStack_28 == (Curl_easy *)0x0) || (pCStack_28->magic != 0xc0dedbad)) {
          return CURLM_BAD_HANDLE;
        }
        if (pCStack_28 != *(Curl_easy **)((long)entry + 0x78)) {
          if (((*(uint *)&(pCStack_28->state).field_0x7be >> 0xc & 1) == 0) &&
             (pCStack_28->conn != (connectdata *)0x0)) {
            multi_done(pCStack_28,CURLE_OK,true);
          }
          local_38->multi = (Curl_multi *)0x0;
          Curl_uint_tbl_remove((uint_tbl *)((long)entry + 8),data._4_4_);
          local_38->mid = 0xffffffff;
          if (local_38->psl == (PslCache *)((long)entry + 0xd8)) {
            local_38->psl = (PslCache *)0x0;
          }
          if ((*(uint *)&(local_38->state).field_0x7be >> 0x14 & 1) != 0) {
            Curl_close(&local_38);
          }
        }
        _Var1 = Curl_uint_tbl_next((uint_tbl *)((long)entry + 8),data._4_4_,
                                   (uint *)((long)&data + 4),&stack0xffffffffffffffd8);
      } while (_Var1);
    }
    Curl_cpool_destroy((cpool *)((long)entry + 0x1b8));
    Curl_cshutdn_destroy((cshutdn *)((long)entry + 0x188),*(Curl_easy **)((long)entry + 0x78));
    if (*(long *)((long)entry + 0x78) != 0) {
      if ((((*(long *)((long)entry + 0x78) != 0) &&
           ((*(ulong *)(*(long *)((long)entry + 0x78) + 0xa2c) >> 0x1e & 1) != 0)) &&
          ((*(long *)(*(long *)((long)entry + 0x78) + 0x1310) == 0 ||
           (0 < *(int *)(*(long *)(*(long *)((long)entry + 0x78) + 0x1310) + 8))))) &&
         (0 < Curl_trc_feat_multi.log_level)) {
        Curl_trc_multi(*(Curl_easy **)((long)entry + 0x78),
                       "multi_cleanup, closing admin handle, done");
      }
      *(undefined8 *)(*(long *)((long)entry + 0x78) + 0x68) = 0;
      Curl_uint_tbl_remove
                ((uint_tbl *)((long)entry + 8),*(uint *)(*(long *)((long)entry + 0x78) + 0x10));
      Curl_close((Curl_easy **)((long)entry + 0x78));
    }
    *(undefined4 *)entry = 0;
    Curl_multi_ev_cleanup((Curl_multi *)entry);
    Curl_hash_destroy((Curl_hash *)((long)entry + 0x158));
    Curl_dnscache_destroy((Curl_dnscache *)((long)entry + 0xa0));
    Curl_psl_destroy((PslCache *)((long)entry + 0xd8));
    Curl_ssl_scache_destroy(*(Curl_ssl_scache **)((long)entry + 0xd0));
    close(*(int *)((long)entry + 0x260));
    multi_xfer_bufs_free((Curl_multi *)entry);
    Curl_uint_bset_destroy((uint_bset *)((long)entry + 0x28));
    Curl_uint_bset_destroy((uint_bset *)((long)entry + 0x38));
    Curl_uint_bset_destroy((uint_bset *)((long)entry + 0x48));
    Curl_uint_tbl_destroy((uint_tbl *)((long)entry + 8));
    (*Curl_cfree)(entry);
    m_local._4_4_ = CURLM_OK;
  }
  else {
    m_local._4_4_ = CURLM_RECURSIVE_API_CALL;
  }
  return m_local._4_4_;
}

Assistant:

CURLMcode curl_multi_cleanup(CURLM *m)
{
  struct Curl_multi *multi = m;
  if(GOOD_MULTI_HANDLE(multi)) {
    void *entry;
    unsigned int mid;
    if(multi->in_callback)
      return CURLM_RECURSIVE_API_CALL;

    /* First remove all remaining easy handles,
     * close internal ones. admin handle is special */
    if(Curl_uint_tbl_first(&multi->xfers, &mid, &entry)) {
      do {
        struct Curl_easy *data = entry;
        if(!GOOD_EASY_HANDLE(data))
          return CURLM_BAD_HANDLE;

#ifdef DEBUGBUILD
        if(mid != data->mid) {
          CURL_TRC_M(data, "multi_cleanup: still present with mid=%u, "
                  "but unexpected data->mid=%u\n", mid, data->mid);
          DEBUGASSERT(0);
        }
#endif

        if(data == multi->admin)
          continue;

        if(!data->state.done && data->conn)
          /* if DONE was never called for this handle */
          (void)multi_done(data, CURLE_OK, TRUE);

        data->multi = NULL; /* clear the association */
        Curl_uint_tbl_remove(&multi->xfers, mid);
        data->mid = UINT_MAX;

#ifdef USE_LIBPSL
        if(data->psl == &multi->psl)
          data->psl = NULL;
#endif
        if(data->state.internal)
          Curl_close(&data);
      }
      while(Curl_uint_tbl_next(&multi->xfers, mid, &mid, &entry));
    }

    Curl_cpool_destroy(&multi->cpool);
    Curl_cshutdn_destroy(&multi->cshutdn, multi->admin);
    if(multi->admin) {
      CURL_TRC_M(multi->admin, "multi_cleanup, closing admin handle, done");
      multi->admin->multi = NULL;
      Curl_uint_tbl_remove(&multi->xfers, multi->admin->mid);
      Curl_close(&multi->admin);
    }

    multi->magic = 0; /* not good anymore */

    Curl_multi_ev_cleanup(multi);
    Curl_hash_destroy(&multi->proto_hash);
    Curl_dnscache_destroy(&multi->dnscache);
    Curl_psl_destroy(&multi->psl);
    Curl_ssl_scache_destroy(multi->ssl_scache);

#ifdef USE_WINSOCK
    WSACloseEvent(multi->wsa_event);
#else
#ifdef ENABLE_WAKEUP
    wakeup_close(multi->wakeup_pair[0]);
#ifndef USE_EVENTFD
    wakeup_close(multi->wakeup_pair[1]);
#endif
#endif
#endif

    multi_xfer_bufs_free(multi);
#ifdef DEBUGBUILD
    if(Curl_uint_tbl_count(&multi->xfers)) {
      multi_xfer_tbl_dump(multi);
      DEBUGASSERT(0);
    }
#endif
    Curl_uint_bset_destroy(&multi->process);
    Curl_uint_bset_destroy(&multi->pending);
    Curl_uint_bset_destroy(&multi->msgsent);
    Curl_uint_tbl_destroy(&multi->xfers);
    free(multi);

    return CURLM_OK;
  }
  return CURLM_BAD_HANDLE;
}